

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineSamplerTests.cpp
# Opt level: O0

vector<vkt::pipeline::Vertex4Tex4,_std::allocator<vkt::pipeline::Vertex4Tex4>_> * __thiscall
vkt::pipeline::anon_unknown_0::SamplerTest::createVertices
          (vector<vkt::pipeline::Vertex4Tex4,_std::allocator<vkt::pipeline::Vertex4Tex4>_>
           *__return_storage_ptr__,SamplerTest *this)

{
  ulong uVar1;
  size_type sVar2;
  reference pvVar3;
  Vector<float,_4> local_30;
  uint local_20;
  undefined1 local_19;
  uint i;
  SamplerTest *this_local;
  vector<vkt::pipeline::Vertex4Tex4,_std::allocator<vkt::pipeline::Vertex4Tex4>_> *vertices;
  
  local_19 = 0;
  _i = this;
  this_local = (SamplerTest *)__return_storage_ptr__;
  createTestQuadMosaic(__return_storage_ptr__,this->m_imageViewType);
  for (local_20 = 0; uVar1 = (ulong)local_20,
      sVar2 = std::vector<vkt::pipeline::Vertex4Tex4,_std::allocator<vkt::pipeline::Vertex4Tex4>_>::
              size(__return_storage_ptr__), uVar1 < sVar2; local_20 = local_20 + 1) {
    tcu::Vector<float,_4>::Vector(&local_30,0.002,0.002,0.002,0.0);
    pvVar3 = std::vector<vkt::pipeline::Vertex4Tex4,_std::allocator<vkt::pipeline::Vertex4Tex4>_>::
             operator[](__return_storage_ptr__,(ulong)local_20);
    tcu::Vector<float,_4>::operator+=(&pvVar3->texCoord,&local_30);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<Vertex4Tex4> SamplerTest::createVertices (void) const
{
	std::vector<Vertex4Tex4> vertices = createTestQuadMosaic(m_imageViewType);
	// Adjust texture coordinate to avoid doing NEAREST filtering exactly on texel boundaries.
	// TODO: Would be nice to base this on number of texels and subtexel precision. But this
	// seems to work.
	for (unsigned int i = 0; i < vertices.size(); ++i) {
		vertices[i].texCoord += tcu::Vec4(0.002f, 0.002f, 0.002f, 0.0f);
	}
	return vertices;
}